

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

LengthUnitSystem
Internal_DimensionLengthDisplay
          (ON_ModelComponent *model_component,LengthDisplay dim_length_display,uint model_sn)

{
  undefined1 local_19;
  undefined4 local_18;
  LengthUnitSystem us;
  uint model_sn_local;
  LengthDisplay dim_length_display_local;
  ON_ModelComponent *model_component_local;
  
  local_19 = ON_DimStyle::LengthUnitSystemFromLengthDisplay(dim_length_display);
  if (local_19 == None) {
    local_18 = model_sn;
    if (model_sn == 0xffffffff) {
      local_18 = ON_ModelComponent::ModelSerialNumber(model_component);
    }
    if (local_18 != 0) {
      local_19 = ON::ModelLengthUnitSystem((ulong)local_18);
    }
  }
  return local_19;
}

Assistant:

static ON::LengthUnitSystem Internal_DimensionLengthDisplay(
  const ON_ModelComponent& model_component,
  ON_DimStyle::LengthDisplay dim_length_display,
  unsigned int model_sn
)
{
  ON::LengthUnitSystem us = ON_DimStyle::LengthUnitSystemFromLengthDisplay(dim_length_display);
  if (ON::LengthUnitSystem::None == us)
  {
    if (ON_UNSET_UINT_INDEX == model_sn)
      model_sn = model_component.ModelSerialNumber();
    if ( model_sn > 0)
      us = ON::ModelLengthUnitSystem(model_sn);
  }
  return us;
}